

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall Catch::Matchers::IsNaNMatcher::~IsNaNMatcher(IsNaNMatcher *this)

{
  MatcherGenericBase::~MatcherGenericBase((MatcherGenericBase *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

IsNaNMatcher() = default;